

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter_impl.hpp
# Opt level: O2

iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
* __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::operator+=(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,difference_type i)

{
  primitive_iterator_t *ppVar1;
  iterator *piVar2;
  value_t vVar3;
  invalid_iterator *__return_storage_ptr__;
  allocator<char> local_39;
  string local_38;
  
  if (this->m_object == (pointer)0x0) {
    __assert_fail("m_object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nowar-fonts[P]otfcc-quad2cubic/include/nlohmann/detail/iterators/iter_impl.hpp"
                  ,0x1e9,
                  "iter_impl<BasicJsonType> &nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator+=(difference_type) [BasicJsonType = const nlohmann::basic_json<>]"
                 );
  }
  vVar3 = this->m_object->m_type;
  if (vVar3 == array) {
    piVar2 = &(this->m_it).array_iterator;
    piVar2->_M_current = piVar2->_M_current + i;
  }
  else {
    if (vVar3 == object) {
      __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"cannot use offsets with object iterators",&local_39);
      invalid_iterator::create(__return_storage_ptr__,0xd1,&local_38);
      __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
    }
    ppVar1 = &(this->m_it).primitive_iterator;
    ppVar1->m_it = ppVar1->m_it + i;
  }
  return this;
}

Assistant:

iter_impl& operator+=(difference_type i)
    {
        assert(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
                JSON_THROW(invalid_iterator::create(209, "cannot use offsets with object iterators"));

            case value_t::array:
            {
                std::advance(m_it.array_iterator, i);
                break;
            }

            default:
            {
                m_it.primitive_iterator += i;
                break;
            }
        }

        return *this;
    }